

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O1

int __thiscall
re2::Regexp::Walker<int>::WalkInternal(Walker<int> *this,Regexp *re,int top_arg,bool use_copy)

{
  ushort uVar1;
  uint uVar2;
  deque<re2::WalkState<int>,std::allocator<re2::WalkState<int>>> *pdVar3;
  undefined8 *puVar4;
  stack<re2::WalkState<int>,_std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>_>
  *psVar5;
  Regexp *pRVar6;
  _Map_pointer ppWVar7;
  WalkState<int> *pWVar8;
  char cVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar13;
  int *piVar14;
  WalkState<int> *pWVar15;
  _Elt_pointer pWVar16;
  int unaff_R12D;
  bool stop;
  int local_1b4;
  undefined1 local_1b0 [384];
  
  Reset(this);
  if (re == (Regexp *)0x0) {
    LogMessage::LogMessage
              ((LogMessage *)local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/walker-inl.h",
               0xa0,3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b0 + 8),"Walk NULL",9);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
  }
  else {
    pdVar3 = (deque<re2::WalkState<int>,std::allocator<re2::WalkState<int>>> *)this->stack_;
    local_1b0._8_4_ = -1;
    local_1b0._24_8_ = (int *)0x0;
    puVar4 = *(undefined8 **)(pdVar3 + 0x30);
    local_1b0._0_8_ = re;
    local_1b0._12_4_ = top_arg;
    if (puVar4 == (undefined8 *)(*(long *)(pdVar3 + 0x40) + -0x20)) {
      std::deque<re2::WalkState<int>,std::allocator<re2::WalkState<int>>>::
      _M_push_back_aux<re2::WalkState<int>>(pdVar3,(WalkState<int> *)local_1b0);
    }
    else {
      puVar4[2] = local_1b0._16_8_;
      puVar4[3] = 0;
      *puVar4 = re;
      puVar4[1] = CONCAT44(top_arg,0xffffffff);
      *(long *)(pdVar3 + 0x30) = *(long *)(pdVar3 + 0x30) + 0x20;
    }
    do {
      psVar5 = this->stack_;
      pWVar16 = (psVar5->c).
                super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pWVar16 ==
          (psVar5->c).super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_first) {
        pWVar16 = (psVar5->c).
                  super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
      }
      pRVar6 = pWVar16[-1].re;
      iVar12 = unaff_R12D;
      if (pWVar16[-1].n == -1) {
        iVar12 = this->max_visits_;
        this->max_visits_ = iVar12 + -1;
        if (iVar12 < 1) {
          this->stopped_early_ = true;
          iVar12 = (*this->_vptr_Walker[5])(this,pRVar6,(ulong)(uint)pWVar16[-1].parent_arg);
        }
        else {
          local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffffffffff00;
          iVar12 = (*this->_vptr_Walker[2])(this,pRVar6,(ulong)(uint)pWVar16[-1].parent_arg);
          pWVar16[-1].pre_arg = iVar12;
          cVar9 = local_1b0[0];
          if (local_1b0[0] == '\0') {
            pWVar16[-1].n = 0;
            pWVar16[-1].child_args = (int *)0x0;
            uVar1 = pRVar6->nsub_;
            iVar12 = unaff_R12D;
            if (uVar1 != 0) {
              if (uVar1 == 1) {
                piVar14 = &pWVar16[-1].child_arg;
              }
              else {
                piVar14 = (int *)operator_new__((ulong)uVar1 << 2);
              }
              pWVar16[-1].child_args = piVar14;
            }
          }
          if (cVar9 == '\0') goto LAB_0011fad1;
        }
LAB_0011fc72:
        std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>::pop_back
                  (&this->stack_->c);
        psVar5 = this->stack_;
        ppWVar7 = (psVar5->c).
                  super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node;
        pWVar15 = (psVar5->c).
                  super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_cur;
        pWVar8 = (psVar5->c).
                 super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_first;
        iVar11 = 1;
        iVar10 = iVar12;
        if (((long)(psVar5->c).
                   super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>.
                   _M_impl.super__Deque_impl_data._M_start._M_last -
             (long)(psVar5->c).
                   super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>.
                   _M_impl.super__Deque_impl_data._M_start._M_cur >> 5) +
            ((long)pWVar15 - (long)pWVar8 >> 5) +
            ((((ulong)((long)ppWVar7 -
                      (long)(psVar5->c).
                            super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
            (ulong)(ppWVar7 == (_Map_pointer)0x0)) * 0x10 != 0) {
          if (pWVar15 == pWVar8) {
            pWVar15 = ppWVar7[-1] + 0x10;
          }
          if (pWVar15[-1].child_args == (int *)0x0) {
            piVar14 = &pWVar15[-1].child_arg;
          }
          else {
            piVar14 = pWVar15[-1].child_args + pWVar15[-1].n;
          }
          *piVar14 = iVar12;
          pWVar15[-1].n = pWVar15[-1].n + 1;
          iVar11 = 0;
          iVar10 = local_1b4;
        }
      }
      else {
LAB_0011fad1:
        uVar1 = pRVar6->nsub_;
        if (uVar1 == 0) {
LAB_0011fc23:
          iVar12 = (*this->_vptr_Walker[3])
                             (this,pRVar6,(ulong)(uint)pWVar16[-1].parent_arg,
                              (ulong)(uint)pWVar16[-1].pre_arg,pWVar16[-1].child_args,
                              (ulong)(uint)pWVar16[-1].n);
          if ((1 < pRVar6->nsub_) && (pWVar16[-1].child_args != (int *)0x0)) {
            operator_delete__(pWVar16[-1].child_args);
          }
          goto LAB_0011fc72;
        }
        if (uVar1 == 1) {
          paVar13 = &pRVar6->field_5;
        }
        else {
          paVar13 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar6->field_5).submany_;
        }
        uVar2 = pWVar16[-1].n;
        iVar11 = 0;
        if ((int)uVar2 < (int)(uint)uVar1) {
          if (((int)uVar2 < 1 || !use_copy) ||
             ((Regexp *)paVar13[uVar2 - 1].submany_ != (Regexp *)paVar13[uVar2].submany_)) {
            pdVar3 = (deque<re2::WalkState<int>,std::allocator<re2::WalkState<int>>> *)this->stack_;
            local_1b0._0_8_ = paVar13[pWVar16[-1].n].submany_;
            local_1b0._12_4_ = pWVar16[-1].pre_arg;
            local_1b0._8_4_ = -1;
            local_1b0._24_8_ = (int *)0x0;
            puVar4 = *(undefined8 **)(pdVar3 + 0x30);
            if (puVar4 == (undefined8 *)(*(long *)(pdVar3 + 0x40) + -0x20)) {
              std::deque<re2::WalkState<int>,std::allocator<re2::WalkState<int>>>::
              _M_push_back_aux<re2::WalkState<int>>(pdVar3,(WalkState<int> *)local_1b0);
            }
            else {
              puVar4[2] = local_1b0._16_8_;
              puVar4[3] = 0;
              *puVar4 = local_1b0._0_8_;
              puVar4[1] = CONCAT44(local_1b0._12_4_,0xffffffff);
              *(long *)(pdVar3 + 0x30) = *(long *)(pdVar3 + 0x30) + 0x20;
            }
          }
          else {
            iVar11 = (*this->_vptr_Walker[4])(this,(ulong)(uint)pWVar16[-1].child_args[uVar2 - 1]);
            pWVar16[-1].child_args[pWVar16[-1].n] = iVar11;
            pWVar16[-1].n = pWVar16[-1].n + 1;
          }
          iVar11 = 3;
        }
        iVar10 = local_1b4;
        if ((int)(uint)uVar1 <= (int)uVar2) goto LAB_0011fc23;
      }
      local_1b4 = iVar10;
      unaff_R12D = iVar12;
    } while ((iVar11 == 0) || (top_arg = local_1b4, iVar11 == 3));
  }
  return top_arg;
}

Assistant:

T Regexp::Walker<T>::WalkInternal(Regexp* re, T top_arg,
                                                       bool use_copy) {
  Reset();

  if (re == NULL) {
    LOG(DFATAL) << "Walk NULL";
    return top_arg;
  }

  stack_->push(WalkState<T>(re, top_arg));

  WalkState<T>* s;
  for (;;) {
    T t;
    s = &stack_->top();
    Regexp* re = s->re;
    switch (s->n) {
      case -1: {
        if (--max_visits_ < 0) {
          stopped_early_ = true;
          t = ShortVisit(re, s->parent_arg);
          break;
        }
        bool stop = false;
        s->pre_arg = PreVisit(re, s->parent_arg, &stop);
        if (stop) {
          t = s->pre_arg;
          break;
        }
        s->n = 0;
        s->child_args = NULL;
        if (re->nsub_ == 1)
          s->child_args = &s->child_arg;
        else if (re->nsub_ > 1)
          s->child_args = new T[re->nsub_];
        // Fall through.
      }
      default: {
        if (re->nsub_ > 0) {
          Regexp** sub = re->sub();
          if (s->n < re->nsub_) {
            if (use_copy && s->n > 0 && sub[s->n - 1] == sub[s->n]) {
              s->child_args[s->n] = Copy(s->child_args[s->n - 1]);
              s->n++;
            } else {
              stack_->push(WalkState<T>(sub[s->n], s->pre_arg));
            }
            continue;
          }
        }

        t = PostVisit(re, s->parent_arg, s->pre_arg, s->child_args, s->n);
        if (re->nsub_ > 1)
          delete[] s->child_args;
        break;
      }
    }

    // We've finished stack_->top().
    // Update next guy down.
    stack_->pop();
    if (stack_->size() == 0)
      return t;
    s = &stack_->top();
    if (s->child_args != NULL)
      s->child_args[s->n] = t;
    else
      s->child_arg = t;
    s->n++;
  }
}